

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

bool __thiscall
CoreML::Specification::PaddingLayerParams::MergePartialFromCodedStream
          (PaddingLayerParams *this,CodedInputStream *input)

{
  byte bVar1;
  byte *pbVar2;
  bool bVar3;
  uint32 uVar4;
  int iVar5;
  PaddingLayerParams_PaddingConstant *this_00;
  ulong extraout_RAX;
  PaddingLayerParams_PaddingReplication *this_01;
  ulong extraout_RAX_00;
  PaddingLayerParams_PaddingReflection *this_02;
  ulong extraout_RAX_01;
  BorderAmounts *this_03;
  ulong extraout_RAX_02;
  char cVar6;
  ulong uVar7;
  int local_44;
  
  do {
    pbVar2 = input->buffer_;
    uVar4 = 0;
    if (pbVar2 < input->buffer_end_) {
      bVar1 = *pbVar2;
      uVar4 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_00219ec9;
      input->buffer_ = pbVar2 + 1;
      uVar7 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_00219ec9:
      uVar4 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar4);
      uVar7 = 0;
      if (uVar4 - 1 < 0x7f) {
        uVar7 = 0x100000000;
      }
      uVar7 = uVar4 | uVar7;
    }
    uVar4 = (uint32)uVar7;
    if ((uVar7 & 0x100000000) == 0) goto switchD_00219f31_caseD_4;
    cVar6 = (char)uVar7;
    switch((uint)(uVar7 >> 3) & 0x1fffffff) {
    case 1:
      if (cVar6 != '\n') break;
      if (this->_oneof_case_[0] != 1) {
        clear_PaddingType(this);
        this->_oneof_case_[0] = 1;
        this_00 = (PaddingLayerParams_PaddingConstant *)operator_new(0x18);
        PaddingLayerParams_PaddingConstant::PaddingLayerParams_PaddingConstant(this_00);
        (this->PaddingType_).constant_ = this_00;
      }
      MergePartialFromCodedStream();
      uVar7 = extraout_RAX;
LAB_0021a088:
      iVar5 = local_44;
      if ((uVar7 & 1) == 0) goto LAB_00219f13;
      goto LAB_00219f15;
    case 2:
      if (cVar6 == '\x12') {
        if (this->_oneof_case_[0] != 2) {
          clear_PaddingType(this);
          this->_oneof_case_[0] = 2;
          this_02 = (PaddingLayerParams_PaddingReflection *)operator_new(0x18);
          PaddingLayerParams_PaddingReflection::PaddingLayerParams_PaddingReflection(this_02);
          (this->PaddingType_).reflection_ = this_02;
        }
        MergePartialFromCodedStream();
        uVar7 = extraout_RAX_01;
        goto LAB_0021a088;
      }
      break;
    case 3:
      if (cVar6 == '\x1a') {
        if (this->_oneof_case_[0] != 3) {
          clear_PaddingType(this);
          this->_oneof_case_[0] = 3;
          this_01 = (PaddingLayerParams_PaddingReplication *)operator_new(0x18);
          PaddingLayerParams_PaddingReplication::PaddingLayerParams_PaddingReplication(this_01);
          (this->PaddingType_).replication_ = this_01;
        }
        MergePartialFromCodedStream();
        uVar7 = extraout_RAX_00;
        goto LAB_0021a088;
      }
      break;
    case 10:
      if (cVar6 == 'R') {
        if (this->paddingamounts_ == (BorderAmounts *)0x0) {
          this_03 = (BorderAmounts *)operator_new(0x30);
          BorderAmounts::BorderAmounts(this_03);
          this->paddingamounts_ = this_03;
        }
        MergePartialFromCodedStream();
        uVar7 = extraout_RAX_02;
        goto LAB_0021a088;
      }
    }
switchD_00219f31_caseD_4:
    iVar5 = 7;
    if ((uVar4 & 7) != 4 && uVar4 != 0) {
      bVar3 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar4);
      if (bVar3) {
LAB_00219f13:
        iVar5 = 0;
      }
      else {
        iVar5 = 6;
      }
    }
LAB_00219f15:
    if (iVar5 != 0) {
      return iVar5 != 6;
    }
  } while( true );
}

Assistant:

bool PaddingLayerParams::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.PaddingLayerParams)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // .CoreML.Specification.PaddingLayerParams.PaddingConstant constant = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(10u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_constant()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.PaddingLayerParams.PaddingReflection reflection = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(18u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_reflection()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.PaddingLayerParams.PaddingReplication replication = 3;
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(26u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_replication()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.BorderAmounts paddingAmounts = 10;
      case 10: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(82u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_paddingamounts()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.PaddingLayerParams)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.PaddingLayerParams)
  return false;
#undef DO_
}